

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O0

int pkey_rsa_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  int *piVar1;
  int iVar2;
  EVP_MD *pEVar3;
  RSA_OAEP_LABEL_PARAMS *params;
  RSA_PKEY_CTX *rctx;
  void *p2_local;
  int p1_local;
  int type_local;
  EVP_PKEY_CTX *ctx_local;
  
  piVar1 = (int *)ctx->data;
  if (type == 1) {
    iVar2 = check_padding_md((EVP_MD *)p2,piVar1[4]);
    if (iVar2 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      *(void **)(piVar1 + 6) = p2;
      ctx_local._4_4_ = 1;
    }
  }
  else if (type == 2) {
    *(undefined8 *)p2 = *(undefined8 *)(piVar1 + 6);
    ctx_local._4_4_ = 1;
  }
  else if (type == 0x1001) {
    iVar2 = is_known_padding(p1);
    if ((((iVar2 == 0) || (iVar2 = check_padding_md(*(EVP_MD **)(piVar1 + 6),p1), iVar2 == 0)) ||
        ((p1 == 6 && ((ctx->operation & 0x18U) == 0)))) ||
       ((p1 == 4 && ((ctx->operation & 0xc0U) == 0)))) {
      ERR_put_error(6,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x16d);
      ctx_local._4_4_ = 0;
    }
    else {
      if (((p1 == 6) || (p1 == 4)) && (*(long *)(piVar1 + 6) == 0)) {
        pEVar3 = EVP_sha1();
        *(EVP_MD **)(piVar1 + 6) = pEVar3;
      }
      piVar1[4] = p1;
      ctx_local._4_4_ = 1;
    }
  }
  else if (type == 0x1002) {
    *(int *)p2 = piVar1[4];
    ctx_local._4_4_ = 1;
  }
  else if (type - 0x1003U < 2) {
    if (piVar1[4] == 6) {
      if (type == 0x1004) {
        *(int *)p2 = piVar1[10];
      }
      else {
        if (p1 < -2) {
          return 0;
        }
        piVar1[10] = p1;
      }
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(6,0,0x74,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x17e);
      ctx_local._4_4_ = 0;
    }
  }
  else if (type == 0x1005) {
    if (p1 < 0x100) {
      ERR_put_error(6,0,0x70,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x18d);
      ctx_local._4_4_ = 0;
    }
    else {
      *piVar1 = p1;
      ctx_local._4_4_ = 1;
    }
  }
  else if (type == 0x1006) {
    if (p2 == (void *)0x0) {
      ctx_local._4_4_ = 0;
    }
    else {
      BN_free(*(BIGNUM **)(piVar1 + 2));
      *(void **)(piVar1 + 2) = p2;
      ctx_local._4_4_ = 1;
    }
  }
  else if (type - 0x1007U < 2) {
    if (piVar1[4] == 4) {
      if (type == 0x1008) {
        *(undefined8 *)p2 = *(undefined8 *)(piVar1 + 6);
      }
      else {
        *(void **)(piVar1 + 6) = p2;
      }
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(6,0,0x73,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x19e);
      ctx_local._4_4_ = 0;
    }
  }
  else if (type - 0x1009U < 2) {
    if ((piVar1[4] == 6) || (piVar1[4] == 4)) {
      if (type == 0x100a) {
        if (*(long *)(piVar1 + 8) == 0) {
          *(undefined8 *)p2 = *(undefined8 *)(piVar1 + 6);
        }
        else {
          *(undefined8 *)p2 = *(undefined8 *)(piVar1 + 8);
        }
      }
      else {
        *(void **)(piVar1 + 8) = p2;
      }
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(6,0,0x71,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x1b7);
      ctx_local._4_4_ = 0;
    }
  }
  else if (type == 0x100b) {
    if (piVar1[4] == 4) {
      OPENSSL_free(*(void **)(piVar1 + 0xe));
      *(undefined8 *)(piVar1 + 0xe) = *p2;
      *(undefined8 *)(piVar1 + 0x10) = *(undefined8 *)((long)p2 + 8);
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(6,0,0x73,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x1c7);
      ctx_local._4_4_ = 0;
    }
  }
  else if (type == 0x100c) {
    if (piVar1[4] == 4) {
      CBS_init((CBS *)p2,*(uint8_t **)(piVar1 + 0xe),*(size_t *)(piVar1 + 0x10));
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(6,0,0x73,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x1d4);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(6,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                  ,0x1db);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_rsa_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  switch (type) {
    case EVP_PKEY_CTRL_RSA_PADDING:
      if (!is_known_padding(p1) || !check_padding_md(rctx->md, p1) ||
          (p1 == RSA_PKCS1_PSS_PADDING &&
           0 == (ctx->operation & (EVP_PKEY_OP_SIGN | EVP_PKEY_OP_VERIFY))) ||
          (p1 == RSA_PKCS1_OAEP_PADDING &&
           0 == (ctx->operation & EVP_PKEY_OP_TYPE_CRYPT))) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_ILLEGAL_OR_UNSUPPORTED_PADDING_MODE);
        return 0;
      }
      if ((p1 == RSA_PKCS1_PSS_PADDING || p1 == RSA_PKCS1_OAEP_PADDING) &&
          rctx->md == NULL) {
        rctx->md = EVP_sha1();
      }
      rctx->pad_mode = p1;
      return 1;

    case EVP_PKEY_CTRL_GET_RSA_PADDING:
      *(int *)p2 = rctx->pad_mode;
      return 1;

    case EVP_PKEY_CTRL_RSA_PSS_SALTLEN:
    case EVP_PKEY_CTRL_GET_RSA_PSS_SALTLEN:
      if (rctx->pad_mode != RSA_PKCS1_PSS_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PSS_SALTLEN);
        return 0;
      }
      if (type == EVP_PKEY_CTRL_GET_RSA_PSS_SALTLEN) {
        *(int *)p2 = rctx->saltlen;
      } else {
        if (p1 < -2) {
          return 0;
        }
        rctx->saltlen = p1;
      }
      return 1;

    case EVP_PKEY_CTRL_RSA_KEYGEN_BITS:
      if (p1 < 256) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_KEYBITS);
        return 0;
      }
      rctx->nbits = p1;
      return 1;

    case EVP_PKEY_CTRL_RSA_KEYGEN_PUBEXP:
      if (!p2) {
        return 0;
      }
      BN_free(rctx->pub_exp);
      rctx->pub_exp = reinterpret_cast<BIGNUM *>(p2);
      return 1;

    case EVP_PKEY_CTRL_RSA_OAEP_MD:
    case EVP_PKEY_CTRL_GET_RSA_OAEP_MD:
      if (rctx->pad_mode != RSA_PKCS1_OAEP_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PADDING_MODE);
        return 0;
      }
      if (type == EVP_PKEY_CTRL_GET_RSA_OAEP_MD) {
        *(const EVP_MD **)p2 = rctx->md;
      } else {
        rctx->md = reinterpret_cast<EVP_MD *>(p2);
      }
      return 1;

    case EVP_PKEY_CTRL_MD:
      if (!check_padding_md(reinterpret_cast<EVP_MD *>(p2), rctx->pad_mode)) {
        return 0;
      }
      rctx->md = reinterpret_cast<EVP_MD *>(p2);
      return 1;

    case EVP_PKEY_CTRL_GET_MD:
      *(const EVP_MD **)p2 = rctx->md;
      return 1;

    case EVP_PKEY_CTRL_RSA_MGF1_MD:
    case EVP_PKEY_CTRL_GET_RSA_MGF1_MD:
      if (rctx->pad_mode != RSA_PKCS1_PSS_PADDING &&
          rctx->pad_mode != RSA_PKCS1_OAEP_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_MGF1_MD);
        return 0;
      }
      if (type == EVP_PKEY_CTRL_GET_RSA_MGF1_MD) {
        if (rctx->mgf1md) {
          *(const EVP_MD **)p2 = rctx->mgf1md;
        } else {
          *(const EVP_MD **)p2 = rctx->md;
        }
      } else {
        rctx->mgf1md = reinterpret_cast<EVP_MD *>(p2);
      }
      return 1;

    case EVP_PKEY_CTRL_RSA_OAEP_LABEL: {
      if (rctx->pad_mode != RSA_PKCS1_OAEP_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PADDING_MODE);
        return 0;
      }
      OPENSSL_free(rctx->oaep_label);
      RSA_OAEP_LABEL_PARAMS *params =
          reinterpret_cast<RSA_OAEP_LABEL_PARAMS *>(p2);
      rctx->oaep_label = params->data;
      rctx->oaep_labellen = params->len;
      return 1;
    }

    case EVP_PKEY_CTRL_GET_RSA_OAEP_LABEL:
      if (rctx->pad_mode != RSA_PKCS1_OAEP_PADDING) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PADDING_MODE);
        return 0;
      }
      CBS_init((CBS *)p2, rctx->oaep_label, rctx->oaep_labellen);
      return 1;

    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
      return 0;
  }
}